

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O1

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_functor::binary_op_min>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [16];
  uint uVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  
  uVar2 = a->c;
  uVar5 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar8 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    if (0 < (int)uVar2) {
      uVar3 = 0;
      do {
        pauVar4 = (undefined1 (*) [16])(a->cstep * uVar3 * a->elemsize + (long)a->data);
        pauVar6 = (undefined1 (*) [16])(b->cstep * uVar3 * b->elemsize + (long)b->data);
        pauVar7 = (undefined1 (*) [16])(c->cstep * uVar3 * c->elemsize + (long)c->data);
        if ((int)uVar5 < 4) {
          uVar9 = 0;
        }
        else {
          iVar8 = 3;
          do {
            auVar11 = minps(*pauVar4,*pauVar6);
            *pauVar7 = auVar11;
            pauVar4 = pauVar4 + 1;
            pauVar6 = pauVar6 + 1;
            pauVar7 = pauVar7 + 1;
            iVar8 = iVar8 + 4;
            uVar9 = uVar5 & 0xfffffffc;
          } while (iVar8 < (int)uVar5);
        }
        if (uVar5 - uVar9 != 0 && (int)uVar9 <= (int)uVar5) {
          lVar10 = 0;
          do {
            fVar1 = *(float *)(*pauVar6 + lVar10 * 4);
            if (*(float *)(*pauVar4 + lVar10 * 4) <= *(float *)(*pauVar6 + lVar10 * 4)) {
              fVar1 = *(float *)(*pauVar4 + lVar10 * 4);
            }
            *(float *)((long)*pauVar7 + lVar10 * 4) = fVar1;
            lVar10 = lVar10 + 1;
          } while (uVar5 - uVar9 != (int)lVar10);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar2);
    }
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}